

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write-cmake.cpp
# Opt level: O0

bool CMakeWriter::gather_all_library_dependencies
               (ChibiInfo *chibi_info,ChibiLibrary *library,
               vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>
               *library_dependencies)

{
  value_type pCVar1;
  bool bVar2;
  reference ppCVar3;
  size_type sVar4;
  char *name;
  undefined8 uVar5;
  undefined8 uVar6;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar7;
  ChibiLibrary *local_110;
  ChibiLibrary *resolved_library;
  undefined1 local_100;
  reference local_f8;
  ChibiLibraryDependency *library_dependency;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_> *__range2;
  ChibiLibrary *library_1;
  ChibiLibrary *local_c0 [3];
  undefined1 local_a8 [8];
  deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> stack;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  traversed_libraries;
  vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>
  *library_dependencies_local;
  ChibiLibrary *library_local;
  ChibiInfo *chibi_info_local;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&stack.super__Deque_base<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_node);
  std::deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::deque
            ((deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> *)local_a8);
  local_c0[0] = library;
  std::deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::push_back
            ((deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> *)local_a8,local_c0
            );
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack.super__Deque_base<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node,&library->name);
  do {
    bVar2 = std::deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::empty
                      ((deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> *)
                       local_a8);
    if (bVar2) {
      chibi_info_local._7_1_ = true;
LAB_00140b3e:
      std::deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::~deque
                ((deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> *)local_a8);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack.
                 super__Deque_base<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>.
                 _M_impl.super__Deque_impl_data._M_finish._M_node);
      return chibi_info_local._7_1_;
    }
    ppCVar3 = std::deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::front
                        ((deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> *)
                         local_a8);
    pCVar1 = *ppCVar3;
    __end2 = std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::begin
                       (&pCVar1->library_dependencies);
    library_dependency =
         (ChibiLibraryDependency *)
         std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::end
                   (&pCVar1->library_dependencies);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
                                       *)&library_dependency), bVar2) {
      local_f8 = __gnu_cxx::
                 __normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
                 ::operator*(&__end2);
      sVar4 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&stack.
                          super__Deque_base<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_f8->name);
      if (sVar4 == 0) {
        pVar7 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack.
                             super__Deque_base<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node,&local_f8->name);
        resolved_library = (ChibiLibrary *)pVar7.first._M_node;
        local_100 = pVar7.second;
        std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>::push_back
                  (library_dependencies,local_f8);
        if (local_f8->type == kType_Generated) {
          name = (char *)std::__cxx11::string::c_str();
          local_110 = ChibiInfo::find_library(chibi_info,name);
          if (local_110 == (ChibiLibrary *)0x0) {
            uVar5 = std::__cxx11::string::c_str();
            uVar6 = std::__cxx11::string::c_str();
            report_error((char *)0x0,"failed to resolve library dependency: %s for library %s",uVar5
                         ,uVar6);
            chibi_info_local._7_1_ = false;
            goto LAB_00140b3e;
          }
          std::deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::push_back
                    ((deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> *)local_a8,
                     &local_110);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_ChibiLibraryDependency_*,_std::vector<ChibiLibraryDependency,_std::allocator<ChibiLibraryDependency>_>_>
      ::operator++(&__end2);
    }
    std::deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_>::pop_front
              ((deque<const_ChibiLibrary_*,_std::allocator<const_ChibiLibrary_*>_> *)local_a8);
  } while( true );
}

Assistant:

static bool gather_all_library_dependencies(const ChibiInfo & chibi_info, const ChibiLibrary & library, std::vector<ChibiLibraryDependency> & library_dependencies)
	{
		std::set<std::string> traversed_libraries;
		std::deque<const ChibiLibrary*> stack;
		
		stack.push_back(&library);
		
		traversed_libraries.insert(library.name);
		
		while (stack.empty() == false)
		{
			const ChibiLibrary * library = stack.front();
			
			for (auto & library_dependency : library->library_dependencies)
			{
				if (traversed_libraries.count(library_dependency.name) == 0)
				{
					traversed_libraries.insert(library_dependency.name);
					
					library_dependencies.push_back(library_dependency);
					
					if (library_dependency.type == ChibiLibraryDependency::kType_Generated)
					{
						const ChibiLibrary * resolved_library = chibi_info.find_library(library_dependency.name.c_str());
						
						if (resolved_library == nullptr)
						{
							report_error(nullptr, "failed to resolve library dependency: %s for library %s", library_dependency.name.c_str(), library->name.c_str());
							return false;
						}

						stack.push_back(resolved_library);
					}
				}
			}
			
			stack.pop_front();
		}
		
		return true;
	}